

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall
helics::Federate::requestTimeIterativeAsync
          (Federate *this,Time nextInternalTimeStep,IterationRequest iterate)

{
  string_view message;
  string_view message_00;
  bool bVar1;
  char *__str;
  undefined8 uVar2;
  undefined8 in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  handle asyncInfo;
  Modes exp;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *in_stack_ffffffffffffff48;
  future<helics::iteration_time> *in_stack_ffffffffffffff58;
  Federate *in_stack_ffffffffffffff68;
  Time in_stack_ffffffffffffff70;
  type *in_stack_ffffffffffffffc0;
  launch __policy;
  
  __policy = (launch)((ulong)in_RSI >> 0x20);
  if (((ulong)in_RDI->_M_str & 0x1000000000000) != 0) {
    __str = (char *)__cxa_allocate_exception(0x28);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,__str);
    message._M_str = (char *)in_stack_ffffffffffffff70.internalTimeCode;
    message._M_len = (size_t)in_stack_ffffffffffffff68;
    InvalidFunctionCall::InvalidFunctionCall((InvalidFunctionCall *)in_RDI,message);
    __cxa_throw(__str,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  }
  bVar1 = std::atomic<helics::Federate::Modes>::compare_exchange_strong
                    ((atomic<helics::Federate::Modes> *)in_stack_ffffffffffffff70.internalTimeCode,
                     (Modes *)in_stack_ffffffffffffff68,(Modes)((ulong)in_RDI >> 0x38),
                     (memory_order)in_RDI);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x28);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,(char *)in_stack_ffffffffffffff58);
    message_00._M_str = (char *)in_stack_ffffffffffffff70.internalTimeCode;
    message_00._M_len = (size_t)in_stack_ffffffffffffff68;
    InvalidFunctionCall::InvalidFunctionCall((InvalidFunctionCall *)in_RDI,message_00);
    __cxa_throw(uVar2,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  }
  preTimeRequestOperations
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,SUB81((ulong)in_RDI >> 0x38,0));
  std::
  unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                *)0x20acc8);
  gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
            (in_stack_ffffffffffffff48);
  std::
  async<helics::Federate::requestTimeIterativeAsync(TimeRepresentation<count_time<9,long>>,helics::IterationRequest)::__0>
            (__policy,in_stack_ffffffffffffffc0);
  gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->
            ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)&stack0xffffffffffffffb0);
  std::future<helics::iteration_time>::operator=
            ((future<helics::iteration_time> *)in_RDI,in_stack_ffffffffffffff58);
  std::future<helics::iteration_time>::~future((future<helics::iteration_time> *)0x20ad32);
  gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
            ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x20ad3c);
  return;
}

Assistant:

void Federate::requestTimeIterativeAsync(Time nextInternalTimeStep, IterationRequest iterate)
{
    if (singleThreadFederate) {
        throw(InvalidFunctionCall(
            "Async function calls and methods are not allowed for single thread federates"));
    }
    auto exp = Modes::EXECUTING;
    if (currentMode.compare_exchange_strong(exp, Modes::PENDING_ITERATIVE_TIME)) {
        preTimeRequestOperations(nextInternalTimeStep, iterate != IterationRequest::NO_ITERATIONS);
        auto asyncInfo = asyncCallInfo->lock();
        asyncInfo->timeRequestIterativeFuture =
            std::async(std::launch::async, [this, nextInternalTimeStep, iterate]() {
                return coreObject->requestTimeIterative(fedID, nextInternalTimeStep, iterate);
            });
    } else {
        throw(InvalidFunctionCall("cannot call request time in present state"));
    }
}